

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_extensions.cpp
# Opt level: O0

bool __thiscall ONX_Model::Read(ONX_Model *this,char *filename,ON_TextLog *error_log)

{
  undefined1 local_260 [8];
  ON_BinaryFile file;
  FILE *fp;
  bool rc;
  ON_TextLog *error_log_local;
  char *filename_local;
  ONX_Model *this_local;
  
  fp._7_1_ = false;
  if ((filename != (char *)0x0) &&
     (file.m_memory_buffer = (uchar *)ON::OpenFile(filename,"rb"),
     (FILE *)file.m_memory_buffer != (FILE *)0x0)) {
    ON_BinaryFile::ON_BinaryFile((ON_BinaryFile *)local_260,read3dm,(FILE *)file.m_memory_buffer);
    fp._7_1_ = Read(this,(ON_BinaryArchive *)local_260,error_log);
    ON::CloseFile((FILE *)file.m_memory_buffer);
    ON_BinaryFile::~ON_BinaryFile((ON_BinaryFile *)local_260);
  }
  return fp._7_1_;
}

Assistant:

bool ONX_Model::Read(const char* filename, ON_TextLog* error_log)
{
  bool rc = false;

  if (nullptr != filename)
  {
    FILE* fp = ON::OpenFile(filename, "rb");
    if ( 0 != fp )
    {
      ON_BinaryFile file(ON::archive_mode::read3dm,fp);
      rc = Read(file, error_log);
      ON::CloseFile(fp);
    }
  }

  return rc;
}